

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

uchar * stbi__load_and_postprocess_8bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar *__ptr;
  uchar *image;
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  uint uVar6;
  stbi__result_info ri;
  stbi__result_info local_3c;
  
  __ptr = (uchar *)stbi__load_main(s,x,y,comp,req_comp,&local_3c,8);
  if (__ptr == (uchar *)0x0) {
    image = (uchar *)0x0;
  }
  else {
    image = __ptr;
    if (local_3c.bits_per_channel != 8) {
      iVar3 = req_comp;
      if (req_comp == 0) {
        iVar3 = *comp;
      }
      uVar6 = *y * *x * iVar3;
      image = (uchar *)malloc((long)(int)uVar6);
      if (image == (uchar *)0x0) {
        puVar1 = (undefined8 *)__tls_get_addr(&PTR_00164d50);
        *puVar1 = "outofmem";
        image = (uchar *)0x0;
      }
      else {
        if (0 < (int)uVar6) {
          uVar4 = 0;
          do {
            image[uVar4] = __ptr[uVar4 * 2 + 1];
            uVar4 = uVar4 + 1;
          } while (uVar6 != uVar4);
        }
        free(__ptr);
      }
      local_3c.bits_per_channel = 8;
    }
    lVar2 = __tls_get_addr(&PTR_00164d50);
    piVar5 = &stbi__vertically_flip_on_load_global;
    if (*(int *)(lVar2 + 0xc) != 0) {
      piVar5 = (int *)(lVar2 + 8);
    }
    if (*piVar5 != 0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(image,*x,*y,req_comp);
    }
  }
  return image;
}

Assistant:

static unsigned char *stbi__load_and_postprocess_8bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 8);

   if (result == NULL)
      return NULL;

   // it is the responsibility of the loaders to make sure we get either 8 or 16 bit.
   STBI_ASSERT(ri.bits_per_channel == 8 || ri.bits_per_channel == 16);

   if (ri.bits_per_channel != 8) {
      result = stbi__convert_16_to_8((stbi__uint16 *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 8;
   }

   // @TODO: move stbi__convert_format to here

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi_uc));
   }

   return (unsigned char *) result;
}